

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  undefined8 uVar1;
  ImTextureID pvVar2;
  ImDrawCallback p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  ImDrawCmd *pIVar8;
  long lVar9;
  uint uVar10;
  
  uVar7 = this->Size;
  if (uVar7 == 0) {
    if (this->Capacity == 0) {
      pIVar8 = (ImDrawCmd *)ImGui::MemAlloc(0x1c0);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar8,this->Data,(long)this->Size * 0x38);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar8;
      this->Capacity = 8;
      lVar9 = (long)this->Size;
    }
    else {
      pIVar8 = this->Data;
      lVar9 = 0;
    }
    pIVar8 = pIVar8 + lVar9;
  }
  else {
    if ((int)uVar7 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                    ,0x4f2,"T *ImVector<ImDrawCmd>::insert(const T *, const T &) [T = ImDrawCmd]");
    }
    if (uVar7 == this->Capacity) {
      uVar10 = (uVar7 >> 1) + uVar7;
      if (uVar10 <= uVar7 + 1) {
        uVar10 = uVar7 + 1;
      }
      pIVar8 = (ImDrawCmd *)ImGui::MemAlloc((ulong)uVar10 * 0x38);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar8,this->Data,(long)this->Size * 0x38);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar8;
      this->Capacity = uVar10;
      uVar7 = this->Size;
      if ((int)uVar7 < 1) goto LAB_00133638;
    }
    else {
      pIVar8 = this->Data;
    }
    memmove(pIVar8 + 1,pIVar8,(ulong)uVar7 * 0x38);
    pIVar8 = this->Data;
  }
LAB_00133638:
  pIVar8->UserCallbackData = v->UserCallbackData;
  uVar10 = v->ElemCount;
  fVar4 = (v->ClipRect).x;
  fVar5 = (v->ClipRect).y;
  fVar6 = (v->ClipRect).z;
  uVar1 = *(undefined8 *)&(v->ClipRect).w;
  pvVar2 = v->TextureId;
  uVar7 = v->IdxOffset;
  p_Var3 = v->UserCallback;
  pIVar8->VtxOffset = v->VtxOffset;
  pIVar8->IdxOffset = uVar7;
  pIVar8->UserCallback = p_Var3;
  *(undefined8 *)&(pIVar8->ClipRect).w = uVar1;
  pIVar8->TextureId = pvVar2;
  pIVar8->ElemCount = uVar10;
  (pIVar8->ClipRect).x = fVar4;
  (pIVar8->ClipRect).y = fVar5;
  (pIVar8->ClipRect).z = fVar6;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }